

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O0

QSslCertificate __thiscall QSslConfiguration::localCertificate(QSslConfiguration *this)

{
  long lVar1;
  bool bVar2;
  QSslCertificatePrivate *in_RDI;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointer<QSslCertificatePrivate> this_00;
  EncodingFormat in_stack_ffffffffffffffe4;
  QByteArray *in_stack_ffffffffffffffe8;
  QSslCertificate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QSslCertificatePrivate_*>)
       (totally_ordered_wrapper<QSslCertificatePrivate_*>)in_RDI;
  QSharedDataPointer<QSslConfigurationPrivate>::operator->
            ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d9bb);
  bVar2 = QList<QSslCertificate>::isEmpty((QList<QSslCertificate> *)0x38d9c7);
  if (bVar2) {
    QByteArray::QByteArray((QByteArray *)0x38d9d7);
    QSslCertificate::QSslCertificate
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
    QByteArray::~QByteArray((QByteArray *)0x38d9f1);
  }
  else {
    QSharedDataPointer<QSslConfigurationPrivate>::operator->
              ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d9fd);
    QList<QSslCertificate>::operator[]((QList<QSslCertificate> *)this_00.d.ptr,(qsizetype)in_RDI);
    QSslCertificate::QSslCertificate((QSslCertificate *)this_00.d.ptr,(QSslCertificate *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
           (QExplicitlySharedDataPointer<QSslCertificatePrivate>)this_00.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QSslCertificate QSslConfiguration::localCertificate() const
{
    if (d->localCertificateChain.isEmpty())
        return QSslCertificate();
    return d->localCertificateChain[0];
}